

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::ArticulatedPart::ArticulatedPart
          (ArticulatedPart *this,KUINT8 ParamChangeIndicator,KUINT16 AttachID,KUINT32 TypeVariant,
          KFLOAT32 Value)

{
  KFLOAT32 Value_local;
  KUINT32 TypeVariant_local;
  KUINT16 AttachID_local;
  KUINT8 ParamChangeIndicator_local;
  ArticulatedPart *this_local;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ArticulatedPart_0032e790;
  this->m_ui8ParmeterChange = ParamChangeIndicator;
  this->m_ui16AttachementID = AttachID;
  this->m_ui32ParamTypeVariant = TypeVariant;
  this->m_f32ParamValue = Value;
  this->m_ui32Padding = 0;
  (this->super_VariableParameter).m_ui8VarParamType = '\0';
  return;
}

Assistant:

ArticulatedPart::ArticulatedPart( KUINT8 ParamChangeIndicator, KUINT16 AttachID, KUINT32 TypeVariant, KFLOAT32 Value ) :
    m_ui8ParmeterChange( ParamChangeIndicator ),
    m_ui16AttachementID( AttachID ),
    m_ui32ParamTypeVariant( TypeVariant ),
    m_f32ParamValue( Value ),
    m_ui32Padding( 0 )
{
    m_ui8VarParamType = ArticulatedPartType;
}